

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

BrotliDecoderErrorCode
duckdb_brotli::DecodeContextMap
          (uint64_t context_map_size,uint64_t *num_htrees,uint8_t **context_map_arg,
          BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint64_t *puVar1;
  ulong uVar2;
  byte bVar3;
  byte *pbVar4;
  uint8_t uVar5;
  int iVar6;
  BrotliRunningContextMapState BVar7;
  uint8_t *__s;
  ulong uVar8;
  HuffmanCode *pHVar9;
  ulong uVar10;
  uint64_t uVar11;
  byte *pbVar12;
  size_t __n;
  BrotliDecoderErrorCode in_R11D;
  BrotliDecoderErrorCode BVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  uint64_t code;
  uint64_t local_60;
  size_t local_58;
  HuffmanCode *local_50;
  uint8_t *local_48;
  ulong local_40;
  uint8_t **local_38;
  
  BVar7 = (s->arena).header.substate_context_map;
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < BVar7) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  switch(BVar7) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar13 = DecodeVarLenUint8(s,br,num_htrees);
    if (BVar13 != BROTLI_DECODER_SUCCESS) {
      return BVar13;
    }
    *num_htrees = *num_htrees + 1;
    (s->arena).header.context_index = 0;
    __s = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,context_map_size);
    *context_map_arg = __s;
    if (__s == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(__s,0,context_map_size);
      return BROTLI_DECODER_SUCCESS;
    }
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    goto switchD_00330337_caseD_2;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    goto LAB_00330499;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_00330337_caseD_4;
  }
  uVar10 = (s->br).bit_pos_;
  bVar16 = uVar10 < 5;
  if (bVar16) {
    pbVar12 = (s->br).next_in;
    if (pbVar12 != (s->br).last_in) {
      (s->br).val_ = (s->br).val_ | (ulong)*pbVar12 << ((byte)uVar10 & 0x3f);
      (s->br).bit_pos_ = uVar10 | 8;
      (s->br).next_in = pbVar12 + 1;
      bVar16 = false;
      goto LAB_003303f0;
    }
  }
  else {
LAB_003303f0:
    uVar10 = (ulong)((uint)br->val_ & 0x1f);
  }
  if (bVar16) {
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  uVar8 = (ulong)((uint)uVar10 & 1);
  (s->arena).header.max_run_length_prefix = (uVar10 >> 1) + 1 & -uVar8;
  puVar1 = &(s->br).bit_pos_;
  *puVar1 = *puVar1 + (-(ulong)(uVar8 == 0) | 0xfffffffffffffffb);
  (s->br).val_ = (s->br).val_ >> ((byte)uVar10 & 1) * '\x04' + 1;
  (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
switchD_00330337_caseD_2:
  uVar11 = (s->arena).header.max_run_length_prefix + *num_htrees;
  BVar13 = ReadHuffmanCode(uVar11,uVar11,(s->arena).header.context_map_table,(uint64_t *)0x0,s);
  if (BVar13 != BROTLI_DECODER_SUCCESS) {
    return BVar13;
  }
  (s->arena).header.code = 0xffff;
  (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
  in_R11D = BROTLI_DECODER_NEEDS_MORE_INPUT;
LAB_00330499:
  uVar10 = (s->arena).header.context_index;
  uVar8 = (s->arena).header.max_run_length_prefix;
  local_48 = *context_map_arg;
  local_60 = (s->arena).header.code;
  bVar15 = local_60 != 0xffff;
  bVar16 = uVar10 < context_map_size || bVar15;
  local_38 = context_map_arg;
  if (uVar10 < context_map_size || bVar15) {
    local_50 = (s->arena).header.context_map_table;
    do {
      if (bVar15) {
LAB_003305c9:
        uVar14 = (s->br).bit_pos_;
        bVar15 = uVar14 < local_60;
        if (bVar15) {
          pbVar12 = (s->br).next_in;
          pbVar4 = (s->br).last_in;
          if (pbVar12 != pbVar4) {
            uVar11 = br->val_;
            do {
              uVar11 = (ulong)*pbVar12 << ((byte)uVar14 & 0x3f) | uVar11;
              (s->br).val_ = uVar11;
              uVar2 = uVar14 + 8;
              (s->br).bit_pos_ = uVar2;
              pbVar12 = pbVar12 + 1;
              (s->br).next_in = pbVar12;
              bVar15 = uVar2 < local_60;
              if (!bVar15) {
                uVar14 = uVar14 + 8;
                goto LAB_0033063e;
              }
              uVar14 = uVar2;
            } while (pbVar12 != pbVar4);
          }
        }
        else {
LAB_0033063e:
          uVar2 = (s->br).val_;
          local_58 = *(ulong *)(kBrotliBitMask + local_60 * 8) & uVar2;
          (s->br).bit_pos_ = uVar14 - local_60;
          (s->br).val_ = uVar2 >> ((byte)local_60 & 0x3f);
        }
        if (bVar15) {
          (s->arena).header.code = local_60;
          (s->arena).header.context_index = uVar10;
          in_R11D = BROTLI_DECODER_NEEDS_MORE_INPUT;
          bVar15 = false;
          uVar14 = uVar10;
        }
        else {
          __n = local_58 + (uint)(1 << ((byte)local_60 & 0x1f));
          uVar14 = __n + uVar10;
          bVar15 = uVar14 <= context_map_size;
          if (bVar15) {
            memset(local_48 + uVar10,0,__n);
            local_58 = 0;
          }
          else {
            in_R11D = BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
            uVar14 = uVar10;
            local_58 = __n;
          }
        }
        if (!bVar15) break;
      }
      else {
        uVar14 = (s->br).bit_pos_;
        bVar15 = uVar14 < 0xf;
        if (bVar15) {
          pbVar12 = (s->br).next_in;
          pbVar4 = (s->br).last_in;
          if (pbVar12 != pbVar4) {
            uVar11 = br->val_;
            do {
              uVar11 = (ulong)*pbVar12 << ((byte)uVar14 & 0x3f) | uVar11;
              (s->br).val_ = uVar11;
              (s->br).bit_pos_ = uVar14 + 8;
              pbVar12 = pbVar12 + 1;
              (s->br).next_in = pbVar12;
              bVar15 = uVar14 < 7;
              if (!bVar15) goto LAB_00330552;
              uVar14 = uVar14 + 8;
            } while (pbVar12 != pbVar4);
          }
        }
        else {
LAB_00330552:
          local_40 = (ulong)((uint)br->val_ & 0x7fff);
        }
        if (bVar15) {
          iVar6 = SafeDecodeSymbol(local_50,br,&local_60);
          if (iVar6 == 0) {
            (s->arena).header.code = 0xffff;
            (s->arena).header.context_index = uVar10;
            in_R11D = BROTLI_DECODER_NEEDS_MORE_INPUT;
            break;
          }
        }
        else {
          pHVar9 = local_50 + (local_40 & 0xff);
          bVar3 = pHVar9->bits;
          if (8 < bVar3) {
            puVar1 = &(s->br).bit_pos_;
            *puVar1 = *puVar1 - 8;
            (s->br).val_ = (s->br).val_ >> 8;
            pHVar9 = pHVar9 + (local_40 >> 8 & *(ulong *)(kBrotliBitMask + (ulong)(bVar3 - 8) * 8))
                              + (ulong)pHVar9->value;
          }
          bVar3 = pHVar9->bits;
          puVar1 = &(s->br).bit_pos_;
          *puVar1 = *puVar1 - (ulong)bVar3;
          (s->br).val_ = (s->br).val_ >> (bVar3 & 0x3f);
          local_60 = (uint64_t)pHVar9->value;
        }
        if (local_60 == 0) {
          uVar5 = '\0';
        }
        else {
          if (local_60 <= uVar8) goto LAB_003305c9;
          uVar5 = (char)local_60 - (char)uVar8;
        }
        local_48[uVar10] = uVar5;
        uVar14 = uVar10 + 1;
      }
      bVar15 = false;
      bVar16 = uVar14 < context_map_size;
      uVar10 = uVar14;
    } while (bVar16);
  }
  context_map_arg = local_38;
  if (bVar16) {
    return in_R11D;
  }
switchD_00330337_caseD_4:
  uVar11 = (s->br).bit_pos_;
  bVar16 = uVar11 == 0;
  if (bVar16) {
    pbVar12 = (s->br).next_in;
    if (pbVar12 == (s->br).last_in) goto LAB_0033078b;
    (s->br).val_ = (s->br).val_ | (ulong)*pbVar12;
    (s->br).bit_pos_ = 8;
    (s->br).next_in = pbVar12 + 1;
    uVar11 = 8;
    bVar16 = false;
  }
  uVar10 = (s->br).val_;
  (s->br).bit_pos_ = uVar11 - 1;
  (s->br).val_ = uVar10 >> 1;
  pbVar12 = (byte *)(ulong)((uVar10 & 1) == 0);
LAB_0033078b:
  if (((ulong)pbVar12 & 1) == 0 && bVar16 == false) {
    InverseMoveToFrontTransform(*context_map_arg,context_map_size,s);
    BVar13 = BROTLI_DECODER_SUCCESS;
    BVar7 = BROTLI_STATE_CONTEXT_MAP_NONE;
  }
  else {
    BVar7 = (uint)bVar16 * 4;
    BVar13 = (uint)bVar16 + BROTLI_DECODER_SUCCESS;
  }
  (s->arena).header.substate_context_map = BVar7;
  return BVar13;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(brotli_reg_t context_map_size, brotli_reg_t *num_htrees,
                                               uint8_t **context_map_arg, BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;
	BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
	BrotliMetablockHeaderArena *h = &s->arena.header;

	switch ((int)h->substate_context_map) {
	case BROTLI_STATE_CONTEXT_MAP_NONE:
		result = DecodeVarLenUint8(s, br, num_htrees);
		if (result != BROTLI_DECODER_SUCCESS) {
			return result;
		}
		(*num_htrees)++;
		h->context_index = 0;
		BROTLI_LOG_UINT(context_map_size);
		BROTLI_LOG_UINT(*num_htrees);
		*context_map_arg = (uint8_t *)BROTLI_DECODER_ALLOC(s, (size_t)context_map_size);
		if (*context_map_arg == 0) {
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
		}
		if (*num_htrees <= 1) {
			memset(*context_map_arg, 0, (size_t)context_map_size);
			return BROTLI_DECODER_SUCCESS;
		}
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
		brotli_reg_t bits;
		/* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
		   to peek 4 bits ahead. */
		if (!BrotliSafeGetBits(br, 5, &bits)) {
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if ((bits & 1) != 0) { /* Use RLE for zeros. */
			h->max_run_length_prefix = (bits >> 1) + 1;
			BrotliDropBits(br, 5);
		} else {
			h->max_run_length_prefix = 0;
			BrotliDropBits(br, 1);
		}
		BROTLI_LOG_UINT(h->max_run_length_prefix);
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_HUFFMAN: {
		brotli_reg_t alphabet_size = *num_htrees + h->max_run_length_prefix;
		result = ReadHuffmanCode(alphabet_size, alphabet_size, h->context_map_table, NULL, s);
		if (result != BROTLI_DECODER_SUCCESS)
			return result;
		h->code = 0xFFFF;
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_DECODE: {
		brotli_reg_t context_index = h->context_index;
		brotli_reg_t max_run_length_prefix = h->max_run_length_prefix;
		uint8_t *context_map = *context_map_arg;
		brotli_reg_t code = h->code;
		BROTLI_BOOL skip_preamble = (code != 0xFFFF);
		while (context_index < context_map_size || skip_preamble) {
			if (!skip_preamble) {
				if (!SafeReadSymbol(h->context_map_table, br, &code)) {
					h->code = 0xFFFF;
					h->context_index = context_index;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				BROTLI_LOG_UINT(code);

				if (code == 0) {
					context_map[context_index++] = 0;
					continue;
				}
				if (code > max_run_length_prefix) {
					context_map[context_index++] = (uint8_t)(code - max_run_length_prefix);
					continue;
				}
			} else {
				skip_preamble = BROTLI_FALSE;
			}
			/* RLE sub-stage. */
			{
				brotli_reg_t reps;
				if (!BrotliSafeReadBits(br, code, &reps)) {
					h->code = code;
					h->context_index = context_index;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				reps += 1U << code;
				BROTLI_LOG_UINT(reps);
				if (context_index + reps > context_map_size) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
				}
				do {
					context_map[context_index++] = 0;
				} while (--reps);
			}
		}
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
		brotli_reg_t bits;
		if (!BrotliSafeReadBits(br, 1, &bits)) {
			h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits != 0) {
			InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
		}
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
		return BROTLI_DECODER_SUCCESS;
	}

	default:
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
	}
}